

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

Mutex * __thiscall absl::lts_20240722::flags_internal::FlagImpl::DataGuard(FlagImpl *this)

{
  FlagImpl *local_28;
  code *local_20;
  undefined8 local_18;
  FlagImpl *local_10;
  FlagImpl *this_local;
  
  local_20 = Init;
  local_18 = 0;
  local_28 = this;
  local_10 = this;
  call_once<void(absl::lts_20240722::flags_internal::FlagImpl::*)(),absl::lts_20240722::flags_internal::FlagImpl*>
            (&this->init_control_,(offset_in_FlagImpl_to_subr *)&local_20,&local_28);
  return (Mutex *)this->data_guard_;
}

Assistant:

absl::Mutex* FlagImpl::DataGuard() const {
  absl::call_once(const_cast<FlagImpl*>(this)->init_control_, &FlagImpl::Init,
                  const_cast<FlagImpl*>(this));

  // data_guard_ is initialized inside Init.
  return reinterpret_cast<absl::Mutex*>(&data_guard_);
}